

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

void __thiscall VRle::Data::opIntersect(Data *this,VRect *r,VRleSpanCb cb,void *userData)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  long lVar11;
  Span *pSVar12;
  ushort uVar13;
  int iVar14;
  pointer pSVar15;
  Span *ptr;
  pointer pSVar16;
  pointer pSVar17;
  Result result;
  Span local_828 [255];
  
  if ((this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    updateBbox(this);
    uVar6 = (this->mBbox).x1;
    uVar8 = (this->mBbox).y1;
    if ((((r->x1 <= (int)uVar6) &&
         (uVar7 = (this->mBbox).x2, uVar9 = (this->mBbox).y2, (int)uVar7 <= r->x2)) &&
        (r->y1 <= (int)uVar8)) && ((int)uVar9 <= r->y2)) {
      pSVar12 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*cb)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pSVar12 >> 3,pSVar12,userData);
      return;
    }
    pSVar17 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar16 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar11 = 0;
    do {
      *(undefined4 *)((long)&local_828[0].y + lVar11 + 1) = 0;
      *(undefined4 *)((long)&local_828[0].x + lVar11) = 0;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x7f8);
    if (pSVar16 != pSVar17) {
      lVar11 = (long)pSVar16 - (long)pSVar17 >> 3;
      do {
        if (0 < lVar11) {
          pSVar15 = pSVar17 + lVar11;
          iVar2 = r->x1;
          iVar3 = r->y1;
          iVar4 = r->x2;
          iVar5 = r->y2;
          lVar10 = 0xff;
          pSVar12 = local_828;
          pSVar16 = pSVar17;
          while( true ) {
            sVar1 = pSVar16->y;
            pSVar17 = pSVar15;
            if (iVar5 <= sVar1) break;
            if (iVar3 <= sVar1) {
              iVar14 = (int)pSVar16->x;
              if ((iVar14 < iVar4) && (iVar2 < (int)((uint)pSVar16->len + iVar14))) {
                if (iVar14 < iVar2) {
                  iVar14 = (iVar14 - iVar2) + (uint)pSVar16->len;
                  if (iVar4 - iVar2 < iVar14) {
                    iVar14 = iVar4 - iVar2;
                  }
                  pSVar12->x = (short)iVar2;
                  uVar13 = (ushort)iVar14;
                }
                else {
                  pSVar12->x = pSVar16->x;
                  uVar13 = (short)iVar4 - pSVar16->x;
                  if (pSVar16->len <= uVar13) {
                    uVar13 = pSVar16->len;
                  }
                }
                pSVar12->len = uVar13;
                if (uVar13 != 0) {
                  pSVar12->y = sVar1;
                  pSVar12->coverage = pSVar16->coverage;
                  pSVar12 = pSVar12 + 1;
                  lVar10 = lVar10 + -1;
                }
              }
            }
            pSVar17 = pSVar16 + 1;
            if ((lVar10 == 0) || (pSVar16 = pSVar17, pSVar15 <= pSVar17)) break;
          }
          lVar11 = (long)pSVar15 - (long)pSVar17 >> 3;
          if (lVar10 != 0xff) {
            (*cb)(0xff - lVar10,local_828,userData);
          }
        }
      } while (lVar11 != 0);
    }
  }
  return;
}

Assistant:

void VRle::Data::opIntersect(const VRect &r, VRle::VRleSpanCb cb,
                             void *userData) const
{
    if (empty()) return;

    if (r.contains(bbox())) {
        cb(mSpans.size(), mSpans.data(), userData);
        return;
    }

    auto   obj = view();
    Result result;
    // run till all the spans are processed
    while (obj.size()) {
        auto count = _opIntersect(r, obj, result);
        if (count) cb(count, result.data(), userData);
    }
}